

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void dbg_msg(char *sys,char *fmt,...)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 auStack_1148 [4];
  int in_stack_ffffffffffffeebc;
  char *in_stack_ffffffffffffeec0;
  int len;
  int i;
  char *msg;
  char *fmt_local;
  char *sys_local;
  char timestr [80];
  char str [4096];
  va_list args;
  
  str[0x28] = '\0';
  str[0x29] = '\0';
  str[0x2a] = '\0';
  str[0x2b] = '\0';
  str[0x2c] = '\0';
  str[0x2d] = '\0';
  str[0x2e] = '\0';
  str[0x2f] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str_timestamp_format(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeebc,(char *)0x163e8d);
  str_format(str,0x1000,"[%s][%s]: ",timestr,sys);
  iVar2 = str_length((char *)0x163ec5);
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].fp_offset = 0x30;
  args[0].gp_offset = 0x10;
  args[0].reg_save_area = auStack_1148;
  vsnprintf(str + iVar2,0x1000 - (long)iVar2,fmt,args);
  for (i = 0; i < num_loggers; i = i + 1) {
    (*loggers[i])(str);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void dbg_msg(const char *sys, const char *fmt, ...)
{
	va_list args;
	char str[1024*4];
	char *msg;
	int i, len;

	char timestr[80];
	str_timestamp_format(timestr, sizeof(timestr), FORMAT_SPACE);

	str_format(str, sizeof(str), "[%s][%s]: ", timestr, sys);

	len = str_length(str);
	msg = (char *)str + len;

	va_start(args, fmt);
#if defined(CONF_FAMILY_WINDOWS) && !defined(__GNUC__)
	_vsprintf_p(msg, sizeof(str)-len, fmt, args);
#else
	vsnprintf(msg, sizeof(str)-len, fmt, args);
#endif
	va_end(args);

	for(i = 0; i < num_loggers; i++)
		loggers[i](str);
}